

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O3

void __thiscall
wallet::coinselector_tests::bnb_sffo_restriction::test_method(bnb_sffo_restriction *this)

{
  CAmount CVar1;
  T *pTVar2;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *psVar3;
  iterator pvVar4;
  CCoinControl *coin_control;
  iterator pvVar5;
  long in_FS_OFFSET;
  bool bVar6;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  check_type cVar7;
  int in_stack_fffffffffffffaf8;
  char *local_500;
  char *local_4f8;
  undefined1 *local_4f0;
  undefined1 *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  undefined1 local_49a;
  Init local_499;
  undefined1 *local_498;
  undefined1 *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> wallet;
  __uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_> local_440;
  _Base_ptr local_438;
  char *local_430;
  unique_ptr<AddrMan,_std::default_delete<AddrMan>_> local_428;
  assertion_result local_420;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock11;
  undefined1 local_3e8 [12];
  uint32_t uStack_3dc;
  pointer local_3d8;
  pointer ppBStack_3d0;
  __uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_> local_3c8;
  pointer puStack_3c0;
  CFeeRate local_3b8;
  CFeeRate local_3b0;
  __uniq_ptr_impl<interfaces::Mining,_std::default_delete<interfaces::Mining>_> local_3a8;
  int iStack_3a0;
  bool bStack_39c;
  undefined2 uStack_39b;
  __uniq_ptr_impl<CScheduler,_std::default_delete<CScheduler>_> local_398;
  Result<wallet::SelectionResult> result;
  CoinsResult available_coins;
  FastRandomContext rand;
  undefined1 local_248 [16];
  __native_type a_Stack_238 [3];
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  local_1b8;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
  local_188;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  local_158;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  local_128;
  _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
  local_f8;
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_wallet::PreselectedInput>,_std::_Select1st<std::pair<const_COutPoint,_wallet::PreselectedInput>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
  local_b0;
  undefined1 local_78 [8];
  element_type *peStack_70;
  shared_count local_68;
  _Base_ptr local_60;
  _Base_ptr local_58;
  size_t local_50;
  CAmount CStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_248._0_8_ = a_Stack_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"","");
  NewWallet((NodeContext *)&wallet,
            (string *)
            (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
            super_BasicTestingSetup.m_node.chain._M_t.
            super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
            super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
            super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl);
  if ((__native_type *)local_248._0_8_ != a_Stack_238) {
    operator_delete((void *)local_248._0_8_,a_Stack_238[0].__align + 1);
  }
  local_248._0_8_ =
       (long)wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl + 0x1e8;
  local_248._8_8_ = local_248._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_248);
  *(undefined4 *)
   ((long)wallet._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>.
          _M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
          super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl + 0x108) = 300;
  *(undefined8 *)
   ((long)wallet._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>.
          _M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
          super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl + 0xe8) = 0;
  *(undefined8 *)
   ((long)wallet._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>.
          _M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
          super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl + 0xf0) = 0;
  *(undefined8 *)
   ((long)wallet._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>.
          _M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
          super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl + 0xf8) = 0;
  *(undefined8 *)
   ((long)wallet._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>.
          _M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
          super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl + 0x100) = 0;
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_248);
  FastRandomContext::FastRandomContext(&rand,false);
  stack0xfffffffffffffc20 = (pointer)0x440000001f;
  local_3d8 = (pointer)0x0;
  ppBStack_3d0 = (pointer)0x0;
  local_3c8._M_t.
  super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
  super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl =
       (tuple<interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>)
       (_Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>)0x0;
  puStack_3c0 = (pointer)0x0;
  local_3b8.nSatoshisPerK = 3000;
  local_3b0.nSatoshisPerK = 1000;
  local_3a8._M_t.
  super__Tuple_impl<0UL,_interfaces::Mining_*,_std::default_delete<interfaces::Mining>_>.
  super__Head_base<0UL,_interfaces::Mining_*,_false>._M_head_impl =
       (tuple<interfaces::Mining_*,_std::default_delete<interfaces::Mining>_>)
       (_Tuple_impl<0UL,_interfaces::Mining_*,_std::default_delete<interfaces::Mining>_>)0x3e8;
  local_398._M_t.super__Tuple_impl<0UL,_CScheduler_*,_std::default_delete<CScheduler>_>.
  super__Head_base<0UL,_CScheduler_*,_false>._M_head_impl =
       (tuple<CScheduler_*,_std::default_delete<CScheduler>_>)
       (_Tuple_impl<0UL,_CScheduler_*,_std::default_delete<CScheduler>_>)0x0;
  uStack_39b._0_1_ = false;
  uStack_39b._1_1_ = false;
  iStack_3a0 = 0;
  bStack_39c = true;
  local_3e8._0_8_ = (ArgsManager *)&rand;
  local_3c8._M_t.
  super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
  super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl =
       (tuple<interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>)
       CFeeRate::GetFee(&local_3b8,0x1f);
  CVar1 = CFeeRate::GetFee((CFeeRate *)&local_3a8,uStack_3dc);
  puStack_3c0 = (pointer)((long)local_3c8._M_t.
                                super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                                .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl +
                         CVar1);
  local_3d8 = (pointer)((long)local_3c8._M_t.
                              super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                              .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl +
                        CVar1 + 1);
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  available_coins.total_amount = 0;
  available_coins.total_effective_amount.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload._M_value = 0;
  available_coins.total_effective_amount.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = true;
  local_248._0_8_ =
       (long)local_3c8._M_t.
             super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
             super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl + 100000000 + CVar1;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  add_coin(&available_coins,
           (CWallet *)
           wallet._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
           ._M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
           super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)local_248,
           local_3b8,6,true,1,false,in_stack_fffffffffffffaf8);
  local_248._0_8_ = (undefined8)((double)(long)puStack_3c0 + 50000000.0);
  add_coin(&available_coins,
           (CWallet *)
           wallet._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
           ._M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
           super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)local_248,
           local_3b8,6,true,1,false,in_stack_fffffffffffffaf8);
  local_248._0_8_ = (mutex_type *)0x2faf080;
  add_coin(&available_coins,
           (CWallet *)
           wallet._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
           ._M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
           super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)local_248,
           local_3b8,6,true,1,false,in_stack_fffffffffffffaf8);
  criticalblock11.super_unique_lock._M_device =
       (mutex_type *)
       ((long)wallet._M_t.
              super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
              super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
              super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl + 0x1e8);
  criticalblock11.super_unique_lock._8_8_ =
       criticalblock11.super_unique_lock._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock11.super_unique_lock);
  local_60 = (_Base_ptr)&peStack_70;
  local_78 = (undefined1  [8])0x0;
  peStack_70 = (element_type *)0x0;
  local_68.pi_ = (sp_counted_base *)0x0;
  local_50 = 0;
  CStack_48 = 0;
  local_58 = local_60;
  CCoinControl::CCoinControl((CCoinControl *)local_248);
  pvVar4 = "";
  coin_control = (CCoinControl *)local_248;
  SelectCoins(&result,(CWallet *)
                      wallet._M_t.
                      super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                      .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,&available_coins
              ,(PreSelectedInputs *)local_78,&COIN,coin_control,(CoinSelectionParams *)local_3e8);
  std::
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_wallet::PreselectedInput>,_std::_Select1st<std::pair<const_COutPoint,_wallet::PreselectedInput>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
  ::~_Rb_tree(&local_b0);
  std::
  _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
  ::~_Rb_tree(&local_f8);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  ::~_Rb_tree(&local_128);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  ::~_Rb_tree(&local_158);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
  ::~_Rb_tree(&local_188);
  std::
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  ::~_Rb_tree(&local_1b8);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_248);
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)local_78);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock11.super_unique_lock);
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_450 = "";
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x799cfc;
  file.m_end = (iterator)0x1e9;
  file.m_begin = (iterator)&local_458;
  msg.m_end = (iterator)coin_control;
  msg.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_468,msg);
  local_78[0] = result.m_variant.super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_index ==
                '\x01';
  peStack_70 = (element_type *)0x0;
  local_68.pi_ = (sp_counted_base *)0x0;
  criticalblock11.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_12d58d5;
  criticalblock11.super_unique_lock._8_8_ = (long)"result.has_value()" + 0x12;
  local_248._8_8_ = local_248._8_8_ & 0xffffffffffffff00;
  local_248._0_8_ = &PTR__lazy_ostream_013ae1c8;
  a_Stack_238[0]._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_478 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_470 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  a_Stack_238[0]._8_8_ = &criticalblock11.super_unique_lock;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,(lazy_ostream *)local_248,1,0,WARN,_cVar7,
             (size_t)&local_478,0x1e9);
  boost::detail::shared_count::~shared_count(&local_68);
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_480 = "";
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1ea;
  file_00.m_begin = (iterator)&local_488;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_498,
             msg_00);
  criticalblock11.super_unique_lock._8_8_ =
       criticalblock11.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock11.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013ae088;
  pTVar2 = util::Result<wallet::SelectionResult>::value(&result);
  local_499 = (Init)pTVar2->m_algo;
  local_248[0] = local_499 == (Init)0x0;
  local_49a = 0;
  local_248._8_8_ = 0;
  a_Stack_238[0].__align = 0;
  local_420.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_499 != (Init)0x0);
  local_420.m_message.px = (element_type *)0x0;
  local_420.m_message.pn.pi_ = (sp_counted_base *)0x0;
  boost::detail::shared_count::~shared_count((shared_count *)&a_Stack_238[0].__data);
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_428._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
       ((long)
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
       + 0x6b);
  a_Stack_238[0]._8_8_ = &local_438;
  local_248._8_8_ = local_248._8_8_ & 0xffffffffffffff00;
  local_248._0_8_ = &PTR__lazy_ostream_013b4d20;
  a_Stack_238[0]._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = (_Base_ptr)&local_440;
  peStack_70 = (element_type *)((ulong)peStack_70 & 0xffffffffffffff00);
  local_78 = (undefined1  [8])&PTR__lazy_ostream_013b4d20;
  local_68.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x3;
  local_440._M_t.super__Tuple_impl<0UL,_ECC_Context_*,_std::default_delete<ECC_Context>_>.
  super__Head_base<0UL,_ECC_Context_*,_false>._M_head_impl =
       (tuple<ECC_Context_*,_std::default_delete<ECC_Context>_>)
       (tuple<ECC_Context_*,_std::default_delete<ECC_Context>_>)&local_49a;
  local_438 = (_Base_ptr)&local_499;
  boost::test_tools::tt_detail::report_assertion
            (&local_420,(lazy_ostream *)&criticalblock11,1,3,REQUIRE,0xf87102,(size_t)&local_430,
             0x1ea,(lazy_ostream *)local_248,"SelectionAlgorithm::BNB",local_78);
  boost::detail::shared_count::~shared_count(&local_420.m_message.pn);
  local_4b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_4a8 = "";
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x1eb;
  file_01.m_begin = (iterator)&local_4b0;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_4c0,
             msg_01);
  pTVar2 = util::Result<wallet::SelectionResult>::value(&result);
  _cVar7 = 0x799f75;
  psVar3 = SelectionResult::GetInputSet(pTVar2);
  local_78[0] = (psVar3->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 2;
  peStack_70 = (element_type *)0x0;
  local_68.pi_ = (sp_counted_base *)0x0;
  criticalblock11.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_1fe507d;
  criticalblock11.super_unique_lock._8_8_ = (long)"result->GetInputSet().size() == 2" + 0x21;
  local_248._8_8_ = local_248._8_8_ & 0xffffffffffffff00;
  local_248._0_8_ = &PTR__lazy_ostream_013ae1c8;
  a_Stack_238[0]._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_4d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_4c8 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  a_Stack_238[0]._8_8_ = (lazy_ostream *)&criticalblock11;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,(lazy_ostream *)local_248,1,0,WARN,_cVar7,
             (size_t)&local_4d0,0x1eb);
  boost::detail::shared_count::~shared_count(&local_68);
  local_4e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_4d8 = "";
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x1ed;
  file_02.m_begin = (iterator)&local_4e0;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_4f0,
             msg_02);
  _cVar7 = 0x79a038;
  pTVar2 = util::Result<wallet::SelectionResult>::value(&result);
  bVar6 = true;
  if (pTVar2->m_algo != SRD) {
    _cVar7 = 0x79a04d;
    pTVar2 = util::Result<wallet::SelectionResult>::value(&result);
    bVar6 = pTVar2->m_algo == KNAPSACK;
  }
  local_78[0] = bVar6;
  peStack_70 = (element_type *)0x0;
  local_68.pi_ = (sp_counted_base *)0x0;
  criticalblock11.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_1fe5097;
  criticalblock11.super_unique_lock._8_8_ =
       (long)
       "result->GetAlgo() == SelectionAlgorithm::SRD || result->GetAlgo() == SelectionAlgorithm::KNAPSACK"
       + 0x61;
  local_248._8_8_ = local_248._8_8_ & 0xffffffffffffff00;
  local_248._0_8_ = &PTR__lazy_ostream_013ae1c8;
  a_Stack_238[0]._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_500 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_4f8 = "";
  a_Stack_238[0]._8_8_ = (lazy_ostream *)&criticalblock11;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,(lazy_ostream *)local_248,1,0,WARN,_cVar7,
             (size_t)&local_500,0x1ed);
  boost::detail::shared_count::~shared_count(&local_68);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
  ~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::SelectionResult> *)&result);
  std::
  _Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
               *)&available_coins);
  ChaCha20::~ChaCha20(&rand.rng);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr(&wallet);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(bnb_sffo_restriction)
{
    // Verify the coin selection process does not produce a BnB solution when SFFO is enabled.
    // This is currently problematic because it could require a change output. And BnB is specialized on changeless solutions.
    std::unique_ptr<CWallet> wallet = NewWallet(m_node);
    WITH_LOCK(wallet->cs_wallet, wallet->SetLastBlockProcessed(300, uint256{})); // set a high block so internal UTXOs are selectable

    FastRandomContext rand{};
    CoinSelectionParams params{
            rand,
            /*change_output_size=*/ 31,  // unused value, p2wpkh output size (wallet default change type)
            /*change_spend_size=*/ 68,   // unused value, p2wpkh input size (high-r signature)
            /*min_change_target=*/ 0,    // dummy, set later
            /*effective_feerate=*/ CFeeRate(3000),
            /*long_term_feerate=*/ CFeeRate(1000),
            /*discard_feerate=*/ CFeeRate(1000),
            /*tx_noinputs_size=*/ 0,
            /*avoid_partial=*/ false,
    };
    params.m_subtract_fee_outputs = true;
    params.m_change_fee = params.m_effective_feerate.GetFee(params.change_output_size);
    params.m_cost_of_change = params.m_discard_feerate.GetFee(params.change_spend_size) + params.m_change_fee;
    params.m_min_change_target = params.m_cost_of_change + 1;
    // Add spendable coin at the BnB selection upper bound
    CoinsResult available_coins;
    add_coin(available_coins, *wallet, COIN + params.m_cost_of_change, /*feerate=*/params.m_effective_feerate, /*nAge=*/6, /*fIsFromMe=*/true, /*nInput=*/0, /*spendable=*/true);
    add_coin(available_coins, *wallet, 0.5 * COIN + params.m_cost_of_change, /*feerate=*/params.m_effective_feerate, /*nAge=*/6, /*fIsFromMe=*/true, /*nInput=*/0, /*spendable=*/true);
    add_coin(available_coins, *wallet, 0.5 * COIN, /*feerate=*/params.m_effective_feerate, /*nAge=*/6, /*fIsFromMe=*/true, /*nInput=*/0, /*spendable=*/true);
    // Knapsack will only find a changeless solution on an exact match to the satoshi, SRD doesn’t look for changeless
    // If BnB were run, it would produce a single input solution with the best waste score
    auto result = WITH_LOCK(wallet->cs_wallet, return SelectCoins(*wallet, available_coins, /*pre_set_inputs=*/{}, COIN, /*coin_control=*/{}, params));
    BOOST_CHECK(result.has_value());
    BOOST_CHECK_NE(result->GetAlgo(), SelectionAlgorithm::BNB);
    BOOST_CHECK(result->GetInputSet().size() == 2);
    // We have only considered BnB, SRD, and Knapsack. Test needs to be reevaluated if new algo is added
    BOOST_CHECK(result->GetAlgo() == SelectionAlgorithm::SRD || result->GetAlgo() == SelectionAlgorithm::KNAPSACK);
}